

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
               (string_view full_tag,string_view tag,StoreT<double> *visitor,InputStream *istream,
               int max_recursion)

{
  int max_recursion_00;
  code *pcVar1;
  string_view full_tag_00;
  undefined8 uVar2;
  size_t sVar3;
  char extraout_AL;
  bool bVar4;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  char extraout_AL_13;
  char extraout_AL_14;
  char extraout_AL_15;
  char extraout_AL_16;
  char extraout_AL_17;
  char extraout_AL_18;
  char extraout_AL_19;
  char extraout_AL_20;
  char extraout_AL_21;
  char extraout_AL_22;
  char extraout_AL_23;
  char extraout_AL_24;
  size_type sVar5;
  char *pcVar6;
  runtime_error *prVar7;
  ulong uVar8;
  char *pcVar9;
  char cVar10;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double __x_15;
  double __x_16;
  double __x_17;
  double __x_18;
  double __x_19;
  double __x_20;
  double __x_21;
  double __x_22;
  double __x_23;
  double __x_24;
  string_view full_tag_01;
  string_view full_tag_02;
  string_view full_tag_03;
  string_view full_tag_04;
  string_view full_tag_05;
  string_view y_00;
  string_view sVar11;
  string_view sVar12;
  MessageBuilder _DOCTEST_MESSAGE_2;
  bool y;
  size_t local_b0;
  char local_a5 [21];
  char *local_90;
  size_t local_88;
  string_view local_80;
  uint32_t size;
  undefined4 uStack_6c;
  StoreT<double> *local_50;
  InputStream *local_48;
  string_view full_tag_local;
  
  uVar8 = tag._len;
  pcVar9 = tag._ptr;
  sVar12._len = full_tag._len;
  local_90 = full_tag._ptr;
  full_tag_local._ptr = local_90;
  full_tag_local._len = sVar12._len;
  if (max_recursion == 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_view::to_string_abi_cxx11_((string *)&y,&full_tag_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_DOCTEST_MESSAGE_2,"Recursion limit exceeded while visiting tag: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y);
    std::runtime_error::runtime_error(prVar7,(string *)&_DOCTEST_MESSAGE_2);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar8 != 0) {
    cVar10 = *pcVar9;
    if (cVar10 == '(') {
      local_b0 = 0;
      if (uVar8 != 1) {
        local_b0 = uVar8 - 2;
      }
      _y = pcVar9 + 1;
      doctest::detail::MessageBuilder::MessageBuilder
                (&_DOCTEST_MESSAGE_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
      doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_10);
      if (extraout_AL_10 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
      doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
      while (sVar11 = tag_pop((string_view *)&y), sVar11._len != 0) {
        full_tag_04._len = sVar12._len;
        full_tag_04._ptr = local_90;
        visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                  (full_tag_04,sVar11,visitor,istream,max_recursion + -1);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                (&_DOCTEST_MESSAGE_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
      doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_11);
      if (extraout_AL_11 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
    }
    else if (cVar10 == '/') {
      local_80._ptr = pcVar9 + 1;
      local_80._len = 0;
      if (uVar8 != 1) {
        local_80._len = uVar8 - 2;
      }
      if (uVar8 < 3) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        string_view::to_string_abi_cxx11_((string *)&size,&local_80);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y,
                       "Invalid enum tag: \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &_DOCTEST_MESSAGE_2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y,"\'")
        ;
        std::runtime_error::runtime_error(prVar7,(string *)&_DOCTEST_MESSAGE_2);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_a5._5_8_ = local_a5;
      visit_arithmetic<mserialize::detail::IntegerToHex,InputStream>
                (*local_80._ptr,(IntegerToHex *)&y,istream);
      uVar8 = 2;
      if (local_80._len < 2) {
        uVar8 = local_80._len;
      }
      local_80._ptr = local_80._ptr + uVar8;
      local_80._len = local_80._len - uVar8;
      remove_prefix_before(&local_80,'\'');
      uVar2 = local_a5._5_8_;
      *(char *)(local_a5._5_8_ + -1) = '\'';
      sVar11._ptr = (char *)(uVar2 + -1);
      local_a5[0] = '`';
      pcVar9 = local_a5 + (1 - (long)sVar11._ptr);
      sVar11._len = (size_t)pcVar9;
      sVar5 = string_view::find(&local_80,sVar11,0);
      if (sVar5 != 0xffffffffffffffff) {
        pcVar6 = pcVar9 + (sVar5 - 1);
        if (local_80._len < pcVar9 + (sVar5 - 1)) {
          pcVar6 = (char *)local_80._len;
        }
        local_80._ptr = local_80._ptr + (long)pcVar6;
        local_80._len = local_80._len + -(long)pcVar6;
        tag_pop_label(&local_80);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                (&_DOCTEST_MESSAGE_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
      doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_03);
      if (extraout_AL_03 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
    }
    else if (cVar10 == '<') {
      local_b0 = 0;
      if (uVar8 != 1) {
        local_b0 = uVar8 - 2;
      }
      _y = pcVar9 + 1;
      local_88 = sVar12._len;
      TrivialDeserializer<unsigned_char>::deserialize<InputStream>((uchar *)&size,istream);
      cVar10 = (char)size + '\x01';
      do {
        sVar12 = tag_pop((string_view *)&y);
        cVar10 = cVar10 + -1;
      } while (cVar10 != '\0');
      doctest::detail::MessageBuilder::MessageBuilder
                (&_DOCTEST_MESSAGE_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
      sVar3 = local_88;
      doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_07);
      if (extraout_AL_07 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
      doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
      y_00._len = 1;
      y_00._ptr = "0";
      bVar4 = mserialize::operator==(sVar12,y_00);
      if (bVar4) {
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_08);
        if (extraout_AL_08 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
      }
      else {
        full_tag_05._len = sVar3;
        full_tag_05._ptr = local_90;
        visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                  (full_tag_05,sVar12,visitor,istream,max_recursion + -1);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                (&_DOCTEST_MESSAGE_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
      doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_13);
      if (extraout_AL_13 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
    }
    else if (cVar10 == '{') {
      local_b0 = uVar8 - 1;
      _y = pcVar9;
      sVar11 = remove_prefix_before((string_view *)&y,'`');
      if (local_b0 == 0) {
        full_tag_03._len = sVar12._len;
        full_tag_03._ptr = local_90;
        _y = resolve_recursive_tag(full_tag_03,sVar11);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                (&_DOCTEST_MESSAGE_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
      doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_04);
      if (extraout_AL_04 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
      local_88 = sVar12._len;
      local_50 = visitor;
      local_48 = istream;
      doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
      while (local_b0 != 0) {
        tag_pop_label((string_view *)&y);
        sVar12 = tag_pop((string_view *)&y);
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_05);
        if (extraout_AL_05 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
        full_tag_00._len = local_88;
        full_tag_00._ptr = local_90;
        visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                  (full_tag_00,sVar12,local_50,local_48,max_recursion + -1);
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_06);
        if (extraout_AL_06 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                (&_DOCTEST_MESSAGE_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
      doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_12);
      if (extraout_AL_12 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
    }
    else if (cVar10 == '[') {
      local_b0 = uVar8 - 1;
      _y = pcVar9 + 1;
      TrivialDeserializer<unsigned_int>::deserialize<InputStream>(&size,istream);
      sVar11 = tag_pop((string_view *)&y);
      doctest::detail::MessageBuilder::MessageBuilder
                (&_DOCTEST_MESSAGE_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
      doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x);
      if (extraout_AL != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
      max_recursion_00 = max_recursion + -1;
      doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
      if ((size < 0x21) ||
         (sVar12._ptr = local_90, bVar4 = singular_impl(sVar12,sVar11,max_recursion_00), !bVar4)) {
        while (bVar4 = size != 0, size = size - 1, bVar4) {
          full_tag_02._len = sVar12._len;
          full_tag_02._ptr = local_90;
          visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                    (full_tag_02,sVar11,visitor,istream,max_recursion_00);
        }
      }
      else {
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_00);
        if (extraout_AL_00 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
        full_tag_01._len = sVar12._len;
        full_tag_01._ptr = local_90;
        visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                  (full_tag_01,sVar11,visitor,istream,max_recursion_00);
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_01);
        if (extraout_AL_01 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                (&_DOCTEST_MESSAGE_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
      doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_02);
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
    }
    else {
      switch(cVar10) {
      case 'b':
        TrivialDeserializer<signed_char>::deserialize<InputStream>(&y,istream);
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_14);
        if (extraout_AL_14 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        break;
      case 'c':
        TrivialDeserializer<char>::deserialize<InputStream>(&y,istream);
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_16);
        if (extraout_AL_16 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        break;
      case 'd':
        TrivialDeserializer<double>::deserialize<InputStream>((double *)&size,istream);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer
                  ((ExpressionDecomposer *)&local_80,DT_CHECK);
        _y = (char *)((long)local_80._ptr << 0x20 | (ulong)visitor->_has_visit ^ 1);
        doctest::detail::Expression_lhs::operator_cast_to_Result
                  ((Result *)&_DOCTEST_MESSAGE_2,(Expression_lhs *)&y);
        doctest::detail::decomp_assert
                  ((detail *)0xa,0x18d2c8,(char *)0x22,0x18eb86,(char *)&_DOCTEST_MESSAGE_2,
                   (Result *)istream);
        doctest::String::~String
                  ((String *)((long)&_DOCTEST_MESSAGE_2.super_MessageData.m_string.field_0 + 8));
        visitor->_has_visit = true;
        visitor->_value = (double)CONCAT44(uStack_6c,size);
        return;
      case 'e':
      case 'g':
      case 'h':
      case 'j':
      case 'k':
switchD_0014999f_caseD_65:
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&y,"Invalid arithmetic tag: ",(allocator *)&size);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &_DOCTEST_MESSAGE_2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y,
                       cVar10);
        std::runtime_error::runtime_error(prVar7,(string *)&_DOCTEST_MESSAGE_2);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case 'f':
        TrivialDeserializer<float>::deserialize<InputStream>((float *)&y,istream);
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_18);
        if (extraout_AL_18 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        break;
      case 'i':
        TrivialDeserializer<int>::deserialize<InputStream>((int *)&y,istream);
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_15);
        if (extraout_AL_15 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        break;
      case 'l':
        TrivialDeserializer<long>::deserialize<InputStream>((long *)&y,istream);
        doctest::detail::MessageBuilder::MessageBuilder
                  (&_DOCTEST_MESSAGE_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
        doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_17);
        if (extraout_AL_17 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        break;
      default:
        if (cVar10 == 'B') {
          TrivialDeserializer<unsigned_char>::deserialize<InputStream>(&y,istream);
          doctest::detail::MessageBuilder::MessageBuilder
                    (&_DOCTEST_MESSAGE_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
          doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_24);
          if (extraout_AL_24 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        }
        else if (cVar10 == 'D') {
          TrivialDeserializer<long_double>::deserialize<InputStream>((longdouble *)&y,istream);
          doctest::detail::MessageBuilder::MessageBuilder
                    (&_DOCTEST_MESSAGE_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
          doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_20);
          if (extraout_AL_20 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        }
        else if (cVar10 == 'I') {
          TrivialDeserializer<unsigned_int>::deserialize<InputStream>((uint *)&y,istream);
          doctest::detail::MessageBuilder::MessageBuilder
                    (&_DOCTEST_MESSAGE_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
          doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_19);
          if (extraout_AL_19 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        }
        else if (cVar10 == 'L') {
          TrivialDeserializer<unsigned_long>::deserialize<InputStream>((unsigned_long *)&y,istream);
          doctest::detail::MessageBuilder::MessageBuilder
                    (&_DOCTEST_MESSAGE_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
          doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_22);
          if (extraout_AL_22 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        }
        else if (cVar10 == 'S') {
          TrivialDeserializer<unsigned_short>::deserialize<InputStream>
                    ((unsigned_short *)&y,istream);
          doctest::detail::MessageBuilder::MessageBuilder
                    (&_DOCTEST_MESSAGE_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
          doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_23);
          if (extraout_AL_23 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        }
        else if (cVar10 == 's') {
          TrivialDeserializer<short>::deserialize<InputStream>((short *)&y,istream);
          doctest::detail::MessageBuilder::MessageBuilder
                    (&_DOCTEST_MESSAGE_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
          doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_21);
          if (extraout_AL_21 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        }
        else {
          if (cVar10 != 'y') goto switchD_0014999f_caseD_65;
          TrivialDeserializer<bool>::deserialize<InputStream>(&y,istream);
          doctest::detail::MessageBuilder::MessageBuilder
                    (&_DOCTEST_MESSAGE_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Unexpected visit of U");
          doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x_09);
          if (extraout_AL_09 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
        }
      }
    }
    doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
  }
  return;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}